

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MDPPolicyIteration.cpp
# Opt level: O0

void __thiscall MDPPolicyIteration::Initialize(MDPPolicyIteration *this)

{
  PlanningUnitDecPOMDPDiscrete *this_00;
  size_t sVar1;
  size_t sVar2;
  MDPSolver *in_RDI;
  Index t;
  uint ja;
  uint s;
  QTable tempTable;
  size_t nrQfunctions;
  size_t nrJA;
  size_t nrS;
  size_t horizon;
  string *in_stack_ffffffffffffff08;
  string *id;
  PlanningUnitMADPDiscrete *in_stack_ffffffffffffff10;
  QTable *pQVar3;
  value_type *in_stack_ffffffffffffff18;
  MDPSolver *S;
  allocator<char> local_c1;
  allocator<char> *in_stack_ffffffffffffff40;
  char *in_stack_ffffffffffffff48;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff50;
  uint local_9c;
  uint local_98;
  uint local_94;
  ulong local_60;
  undefined1 local_29 [41];
  
  S = in_RDI + 1;
  pQVar3 = (QTable *)local_29;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_ffffffffffffff50,in_stack_ffffffffffffff48,in_stack_ffffffffffffff40);
  TimedAlgorithm::StartTimer((TimedAlgorithm *)in_stack_ffffffffffffff10,in_stack_ffffffffffffff08);
  std::__cxx11::string::~string((string *)(local_29 + 1));
  std::allocator<char>::~allocator((allocator<char> *)local_29);
  this_00 = MDPSolver::GetPU(in_RDI);
  local_60 = PlanningUnit::GetHorizon((PlanningUnit *)this_00);
  MDPSolver::GetPU(in_RDI);
  sVar1 = PlanningUnitMADPDiscrete::GetNrStates(in_stack_ffffffffffffff10);
  MDPSolver::GetPU(in_RDI);
  sVar2 = PlanningUnitMADPDiscrete::GetNrJointActions((PlanningUnitMADPDiscrete *)0x87c1c6);
  if (local_60 == 999999) {
    *(undefined1 *)((long)&in_RDI[3]._m_pu + 1) = 0;
    local_60 = 1;
  }
  else {
    *(undefined1 *)((long)&in_RDI[3]._m_pu + 1) = 1;
  }
  QTable::QTable(pQVar3,(size_t)S,(size_t)in_RDI);
  for (local_94 = 0; local_94 != sVar1; local_94 = local_94 + 1) {
    for (local_98 = 0; local_98 != sVar2; local_98 = local_98 + 1) {
      in_stack_ffffffffffffff18 =
           (value_type *)
           boost::numeric::ublas::
           matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>
           ::operator()((matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>
                         *)in_stack_ffffffffffffff10,(size_type)in_stack_ffffffffffffff08,0x87c2b1);
      (in_stack_ffffffffffffff18->super_QTableInterface)._vptr_QTableInterface = (_func_int **)0x0;
    }
  }
  for (local_9c = 0; local_9c < local_60; local_9c = local_9c + 1) {
    std::vector<QTable,_std::allocator<QTable>_>::push_back
              ((vector<QTable,_std::allocator<QTable>_> *)in_RDI,in_stack_ffffffffffffff18);
  }
  *(undefined1 *)&in_RDI[3]._m_pu = 1;
  id = (string *)(in_RDI + 1);
  pQVar3 = (QTable *)&local_c1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_ffffffffffffff50,in_stack_ffffffffffffff48,in_stack_ffffffffffffff40);
  TimedAlgorithm::StopTimer((TimedAlgorithm *)pQVar3,id);
  std::__cxx11::string::~string((string *)&stack0xffffffffffffff40);
  std::allocator<char>::~allocator(&local_c1);
  QTable::~QTable(pQVar3);
  return;
}

Assistant:

void MDPPolicyIteration::Initialize()
{
    StartTimer("Initialize");


    size_t horizon = GetPU()->GetHorizon();
    size_t nrS = GetPU()->GetNrStates();
    size_t nrJA =  GetPU()->GetNrJointActions();

    size_t nrQfunctions;
    if(horizon==MAXHORIZON)
    {
        _m_finiteHorizon=false;
        nrQfunctions=1;
    }
    else
    {
        _m_finiteHorizon=true;
        nrQfunctions=horizon;
    }

    QTable tempTable(nrS,nrJA);
    for(unsigned int s=0;s!=nrS;++s)
        for(unsigned int ja=0;ja!=nrJA;++ja)
            tempTable(s,ja)=0;

    for(Index t=0; t < nrQfunctions; t++)
        _m_QValues.push_back(tempTable);

    _m_initialized = true;


    StopTimer("Initialize");
}